

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O1

time_t RelativeMonth(time_t Start,time_t Timezone,time_t RelMonth)

{
  tm *ptVar1;
  time_t tVar2;
  long lVar3;
  time_t in_stack_ffffffffffffffd8;
  time_t Start_local;
  
  if (RelMonth == 0) {
    tVar2 = 0;
  }
  else {
    Start_local = Start;
    ptVar1 = localtime(&Start_local);
    lVar3 = ptVar1->tm_mon + RelMonth + (long)(ptVar1->tm_year * 0xc + 0x5910);
    Convert(lVar3 % 0xc + 1,(long)ptVar1->tm_mday,lVar3 / 0xc,(long)ptVar1->tm_hour,
            (long)ptVar1->tm_min,(long)ptVar1->tm_sec,Timezone,DSTmaybe);
    tVar2 = DSTcorrect(in_stack_ffffffffffffffd8,0x4a1e2b);
  }
  return tVar2;
}

Assistant:

static time_t
RelativeMonth(time_t Start, time_t Timezone, time_t RelMonth)
{
	struct tm	*tm;
	time_t	Month;
	time_t	Year;

	if (RelMonth == 0)
		return 0;
	tm = localtime(&Start);
	Month = 12 * (tm->tm_year + 1900) + tm->tm_mon + RelMonth;
	Year = Month / 12;
	Month = Month % 12 + 1;
	return DSTcorrect(Start,
	    Convert(Month, (time_t)tm->tm_mday, Year,
		(time_t)tm->tm_hour, (time_t)tm->tm_min, (time_t)tm->tm_sec,
		Timezone, DSTmaybe));
}